

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O1

void __thiscall
pm::PinHole::renderScene
          (PinHole *this,World *world,Tracer *tracer,RGBColor *frame,int startX,int startY,
          int tileWidth,int tileHeight,bool progressive)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_00000084;
  int iVar6;
  float fVar7;
  float fVar8;
  Vector3 VVar9;
  Vector2 sp;
  Ray ray;
  int local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_6c;
  float local_68;
  float fStack_64;
  ulong local_60;
  float local_58;
  float local_54;
  undefined8 local_50;
  float fStack_48;
  float fStack_44;
  undefined8 local_40;
  RGBColor *local_38;
  
  local_60 = CONCAT44(in_register_00000084,startX);
  local_40._0_4_ = 0.0;
  local_40._4_4_ = 0.0;
  local_50._0_4_ = (this->super_Camera).eye_.x;
  local_50._4_4_ = (this->super_Camera).eye_.y;
  _fStack_48 = (Sampler *)CONCAT44(1.0,(this->super_Camera).eye_.z);
  fVar7 = (world->viewplane_).pixelSize_ / this->zoom_;
  iVar2 = 1;
  local_38 = frame;
  if (!progressive) {
    iVar2 = SamplerState::numSamples(&(world->viewplane_).samplerState_);
  }
  if (0 < tileHeight) {
    iVar3 = (int)local_60;
    local_98 = startY;
    do {
      if (0 < tileWidth) {
        uVar5 = local_60 & 0xffffffff;
        do {
          iVar4 = (int)uVar5;
          if (iVar2 < 1) {
            local_8c = 0.0;
            local_90 = 0.0;
            local_94 = 0.0;
          }
          else {
            local_94 = 0.0;
            local_90 = 0.0;
            local_8c = 0.0;
            iVar6 = iVar2;
            do {
              SamplerState::sampleUnitSquare((SamplerState *)&local_58);
              VVar9 = rayDirection((PinHole *)&local_6c,
                                   ((float)(world->viewplane_).width_ * -0.5 + (float)iVar4 +
                                   local_58) * fVar7,
                                   ((float)(world->viewplane_).height_ * -0.5 + (float)local_98 +
                                   local_54) * fVar7);
              _fStack_48 = (Sampler *)CONCAT44(local_6c,fStack_48);
              local_40._4_4_ = fStack_64;
              local_40._0_4_ = local_68;
              (*tracer->_vptr_Tracer[3])
                        (local_6c,VVar9.z,(PinHole *)&local_6c,tracer,world,&local_50,0);
              local_94 = local_94 + local_6c;
              local_90 = local_90 + local_68;
              local_8c = local_8c + fStack_64;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          iVar6 = SamplerState::numSamples(&(world->viewplane_).samplerState_);
          fVar8 = (float)iVar6;
          fVar1 = (this->super_Camera).exposureTime_;
          iVar6 = (world->viewplane_).width_ * local_98 + iVar4;
          local_38[iVar6].r = (local_94 / fVar8) * fVar1 + local_38[iVar6].r;
          local_38[iVar6].g = (local_90 / fVar8) * fVar1 + local_38[iVar6].g;
          local_38[iVar6].b = (local_8c / fVar8) * fVar1 + local_38[iVar6].b;
          uVar5 = (ulong)(iVar4 + 1U);
        } while ((int)(iVar4 + 1U) < iVar3 + tileWidth);
      }
      local_98 = local_98 + 1;
    } while (local_98 < tileHeight + startY);
  }
  return;
}

Assistant:

void PinHole::renderScene(World &world, Tracer &tracer, RGBColor *frame, int startX, int startY, int tileWidth, int tileHeight, bool progressive)
{
	Ray ray;
	ray.o = eye_;
	const ViewPlane &vp = world.viewPlane();

	int depth = 0; // recursion depth
	const float pixelSize = vp.pixelSize() / zoom_;

	const int numSamples = progressive ? 1 : vp.samplerState().numSamples();
	for (int r = startY; r < startY + tileHeight; r++)
	{
		for (int c = startX; c < startX + tileWidth; c++)
		{
			RGBColor pixel(0.0f, 0.0f, 0.0f);
			for (int j = 0; j < numSamples; j++)
			{
				const Vector2 sp = vp.samplerState().sampleUnitSquare();
				const float x = pixelSize * (c - 0.5f * vp.width() + sp.x);
				const float y = pixelSize * (r - 0.5f * vp.height() + sp.y);
				ray.d = rayDirection(x, y);
				pixel += tracer.traceRay(world, ray, depth);
			}
			// Divide by number of samples even in progressive mode or the image gets too bright
			pixel /= static_cast<float>(vp.samplerState().numSamples());
			pixel *= exposureTime_;
			frame[r * vp.width() + c] += pixel;
		}
	}
}